

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::SupportedInStage
          (ShaderImageLoadStoreBase *this,int stage,int required)

{
  bool bVar1;
  
  switch(stage) {
  case 0:
    bVar1 = SupportedInVS(this,8);
    return bVar1;
  case 1:
    bVar1 = SupportedInTCS(this,8);
    return bVar1;
  case 2:
    bVar1 = SupportedInTES(this,8);
    return bVar1;
  case 3:
    bVar1 = SupportedInGS(this,8);
    return bVar1;
  default:
    return true;
  }
}

Assistant:

bool SupportedInStage(int stage, int required)
	{
		switch (stage)
		{
		case 0:
			return SupportedInVS(required);
		case 1:
			return SupportedInTCS(required);
		case 2:
			return SupportedInTES(required);
		case 3:
			return SupportedInGS(required);
		default:
			return true;
		}
	}